

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O1

void __thiscall Meter::setRadius(Meter *this,uint r)

{
  uint uVar1;
  
  uVar1 = 0x2d;
  if (0x2d < r) {
    uVar1 = r;
  }
  ((this->d).d)->radius = uVar1;
  QWidget::resize((QSize *)this);
  QWidget::update();
  return;
}

Assistant:

void
Meter::setRadius( uint r )
{
	if( r < 45 )
		r = 45;

	d->radius = r;

	resize( sizeHint() );

	update();
}